

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

StackScriptFunction * __thiscall
Js::InterpreterStackFrame::GetStackNestedFunction(InterpreterStackFrame *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  StackScriptFunction *pSVar5;
  
  if (*(uint **)(*(long *)(this + 0x88) + 0xa8) == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = **(uint **)(*(long *)(this + 0x88) + 0xa8);
  }
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1e97,"(index < this->m_functionBody->GetNestedCount())",
                                "index < this->m_functionBody->GetNestedCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pSVar5 = (StackScriptFunction *)0x0;
  if ((*(byte *)(*(long *)(this + 0x88) + 0x48) & 1) != 0) {
    pSVar5 = (StackScriptFunction *)((ulong)index * 0x50 + *(long *)(this + 0x48));
  }
  return pSVar5;
}

Assistant:

StackScriptFunction * InterpreterStackFrame::GetStackNestedFunction(uint index)
    {
        Assert(index < this->m_functionBody->GetNestedCount());
        // Re-check if we have disable stack nested function
        if (this->m_functionBody->DoStackNestedFunc())
        {
            return this->stackNestedFunctions + index;
        }
        return nullptr;
    }